

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O2

void ztast_statement_append
               (ztast_t *ast,ztast_statement_t *statementlist,ztast_statement_t *appendee)

{
  ztast_statement_t *stmt;
  ztast_statement_t *pzVar1;
  
  do {
    pzVar1 = statementlist;
    statementlist = pzVar1->next;
  } while (statementlist != (ztast_statement *)0x0);
  pzVar1->next = appendee;
  return;
}

Assistant:

void ztast_statement_append(ztast_t           *ast,
                            ztast_statement_t *statementlist,
                            ztast_statement_t *appendee)
{
  ztast_statement_t *stmt;

  assert(ast);
  assert(statementlist);
  assert(appendee);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_statement_append %p to %p", appendee, statementlist);
#endif

  for (stmt = statementlist; stmt->next != NULL; stmt = stmt->next)
    ;
  stmt->next = appendee;

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn(" -> %p\n", stmt);
#endif
}